

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O3

void __thiscall
el::base::utils::
Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::deepCopy(Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,AbstractRegistry<el::Logger,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>_>_>_>
                 *sr)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Logger *this_00;
  undefined8 *puVar2;
  
  iVar1 = (*(sr->super_ThreadSafe)._vptr_ThreadSafe[7])(sr);
  puVar2 = (undefined8 *)CONCAT44(extraout_var,iVar1);
  while( true ) {
    iVar1 = (*(sr->super_ThreadSafe)._vptr_ThreadSafe[8])(sr);
    if (puVar2 == (undefined8 *)CONCAT44(extraout_var_00,iVar1)) break;
    this_00 = (Logger *)operator_new(0x290);
    Logger::Logger(this_00,(Logger *)puVar2[5]);
    (*(this->
      super_AbstractRegistry<el::Logger,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>_>_>_>
      ).super_ThreadSafe._vptr_ThreadSafe[0xf])(this,puVar2 + 1,this_00);
    puVar2 = (undefined8 *)*puVar2;
  }
  return;
}

Assistant:

virtual void deepCopy(const AbstractRegistry<T_Ptr, std::unordered_map<T_Key, T_Ptr*>>& sr) ELPP_FINAL {
    for (const_iterator it = sr.cbegin(); it != sr.cend(); ++it) {
      registerNew(it->first, new T_Ptr(*it->second));
    }
  }